

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O0

void __thiscall xray_re::xr_key::save(xr_key *this,xr_writer *w)

{
  long local_20;
  uint_fast32_t i;
  xr_writer *w_local;
  xr_key *this_local;
  
  xr_writer::w_float(w,this->value);
  xr_writer::w_float(w,this->time);
  xr_writer::w_u8(w,this->shape);
  if (this->shape != '\x04') {
    xr_writer::w_float_q16(w,this->tension,-32.0,32.0);
    xr_writer::w_float_q16(w,this->continuity,-32.0,32.0);
    xr_writer::w_float_q16(w,this->bias,-32.0,32.0);
    for (local_20 = 0; local_20 != 4; local_20 = local_20 + 1) {
      xr_writer::w_float_q16(w,this->param[local_20],-32.0,32.0);
    }
  }
  return;
}

Assistant:

void xr_key::save(xr_writer& w) const
{
	w.w_float(value);
	w.w_float(time);
	w.w_u8(shape);
	if (shape != SHAPE_STEP) {
		w.w_float_q16(tension, -32.f, 32.f);
		w.w_float_q16(continuity, -32.f, 32.f);
		w.w_float_q16(bias, -32.f, 32.f);
		for (uint_fast32_t i = 0; i != 4; ++i)
			w.w_float_q16(param[i], -32.f, 32.f);
	}
}